

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

Interaction * __thiscall pbrt::Vertex::GetInteraction(Vertex *this)

{
  Vertex *this_local;
  anon_union_248_3_83785cfc_for_Vertex_2 *local_8;
  
  local_8 = &this->field_2;
  return (Interaction *)local_8;
}

Assistant:

const Interaction &GetInteraction() const {
        switch (type) {
        case VertexType::Medium:
            return mi;
        case VertexType::Surface:
            return si;
        default:
            return ei;
        }
    }